

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::return_function(Simulator *this,PCode *code)

{
  ScopeTree *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  Symbol *pSVar4;
  ScopeNode *pSVar5;
  char *__end;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"__ret__","");
  this_00 = &this->tree_;
  pSVar4 = ScopeTree::resolve(this_00,&local_50);
  this->eip_ = (pSVar4->value_).int_value;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  do {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"__ret__","");
    pSVar5 = ScopeTree::resolve_scope(this_00,&local_50);
    iVar2 = ScopeNode::level(pSVar5);
    pSVar5 = ScopeTree::current(this_00);
    iVar3 = ScopeNode::level(pSVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    ScopeTree::pop(this_00);
  } while (iVar2 != iVar3);
  return;
}

Assistant:

void Simulator::return_function(const PCode &code) {
    set_eip(tree_.resolve("__ret__").int_value());
    while (tree_.resolve_scope("__ret__")->level() != tree_.current()->level()) {
        tree_.pop();
    }
    tree_.pop();
}